

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,int n)

{
  uint uVar1;
  long lVar2;
  byte local_4 [4];
  
  lVar2 = (long)(this->IDStack).Size;
  if (0 < lVar2) {
    uVar1 = ~(this->IDStack).Data[lVar2 + -1];
    lVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ GCrc32LookupTable[(uint)local_4[lVar2] ^ uVar1 & 0xff];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    return ~uVar1;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x695,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(int n)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO(id, ImGuiDataType_S32, (intptr_t)n);
#endif
    return id;
}